

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O0

char * ask_user_name(char *szPrompt,char *szDefault)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *__dest;
  bool bVar4;
  char *szNewResult;
  char *s2;
  char *s1;
  char *szResult;
  char *in_stack_000003b8;
  char *in_stack_000003c0;
  char *local_28;
  char *local_20;
  
  pcVar2 = ask_user_string(in_stack_000003c0,in_stack_000003b8);
  local_20 = pcVar2;
  while( true ) {
    iVar1 = isspace((int)*local_20);
    bVar4 = false;
    if ((iVar1 != 0) && (bVar4 = false, *local_20 != '\0')) {
      bVar4 = *local_20 != '\n';
    }
    if (!bVar4) break;
    local_20 = local_20 + 1;
  }
  local_28 = local_20;
  while( true ) {
    iVar1 = isspace((int)*local_28);
    bVar4 = false;
    if ((iVar1 == 0) && (bVar4 = false, *local_28 != '\0')) {
      bVar4 = *local_28 != '\n';
    }
    if (!bVar4) break;
    local_28 = local_28 + 1;
  }
  *local_28 = '\0';
  sVar3 = strlen(local_20);
  __dest = (char *)operator_new__(sVar3 + 1);
  strcpy(__dest,local_20);
  if (pcVar2 != (char *)0x0) {
    operator_delete(pcVar2,1);
  }
  return __dest;
}

Assistant:

char*
ask_user_name (const char* szPrompt, const char* szDefault)
{
  char	*szResult = ask_user_string(szPrompt, szDefault);
  char	*s1, *s2, *szNewResult;

  // strip spaces
  s1 = szResult;
  while(isspace(*s1) && '\0' != *s1 && '\n' != *s1)
    ++s1;

  s2 = s1;
  while(!isspace(*s2) && '\0' != *s2 && '\n' != *s2)
    ++s2;
  *s2 = '\0';

  szNewResult = new char[strlen(s1) + 1];
  strcpy(szNewResult, s1);

  delete szResult;

  return szNewResult;
}